

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_SWARM(effect_handler_context_t *context)

{
  _Bool _Var1;
  source sVar2;
  source origin;
  loc_conflict lStack_20;
  wchar_t flg;
  loc_conflict target;
  wchar_t num;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  target.y = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  target.x = (context->value).m_bonus;
  lStack_20 = (loc_conflict)loc_sum(player->grid,ddgrid[context->dir]);
  if ((context->dir == L'\x05') && (_Var1 = target_okay(), _Var1)) {
    target_get((loc *)&stack0xffffffffffffffe0);
  }
  while (target.x != L'\0') {
    target.x = target.x + L'\xffffffff';
    sVar2 = source_player();
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    origin.which.trap = sVar2.which.trap;
    _Var1 = project(origin,context->radius,lStack_20,target.y,context->subtype,L'|',L'\0','\0',
                    context->obj);
    if (_Var1) {
      context->ident = true;
    }
  }
  return true;
}

Assistant:

bool effect_handler_SWARM(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int num = context->value.m_bonus;

	struct loc target = loc_sum(player->grid, ddgrid[context->dir]);

	int flg = PROJECT_THRU | PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Ask for a target if no direction given (early detonation) */
	if ((context->dir == DIR_TARGET) && target_okay()) {
		target_get(&target);
	}

	while (num--) {
		/* Aim at the target.  Hurt items on floor. */
		if (project(source_player(), context->radius, target, dam,
					context->subtype, flg, 0, 0, context->obj))
			context->ident = true;
	}

	return true;
}